

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

void deqp::gls::anon_unknown_1::logProgram(TestLog *log,Functions *gl,deUint32 program)

{
  bool bVar1;
  MessageBuilder *pMVar2;
  deUint32 in_ECX;
  char *local_408;
  MessageBuilder local_400;
  MessageBuilder local_280;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  ScopedLogSection local_b0;
  ScopedLogSection infoLogSection;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  ScopedLogSection local_48;
  ScopedLogSection linkInfo;
  string programInfoLog;
  bool programLinkOk;
  deUint32 program_local;
  Functions *gl_local;
  TestLog *log_local;
  
  bVar1 = getProgramLinkStatus(gl,program);
  gls::(anonymous_namespace)::getProgramInfoLog_abi_cxx11_
            ((string *)&linkInfo,(_anonymous_namespace_ *)gl,(Functions *)(ulong)program,in_ECX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Program Link Info",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Program Link Info",
             (allocator<char> *)((long)&infoLogSection.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_48,log,&local_68,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&infoLogSection.m_log + 7));
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Info Log",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Info Log",&local_f9);
  tcu::ScopedLogSection::ScopedLogSection(&local_b0,log,&local_d0,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  tcu::TestLog::operator<<(&local_280,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_280,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&linkInfo
                     );
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_280);
  tcu::ScopedLogSection::~ScopedLogSection(&local_b0);
  tcu::TestLog::operator<<(&local_400,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_400,(char (*) [14])"Link result: ");
  local_408 = "Fail";
  if (bVar1) {
    local_408 = "Ok";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_408);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_400);
  tcu::ScopedLogSection::~ScopedLogSection(&local_48);
  std::__cxx11::string::~string((string *)&linkInfo);
  return;
}

Assistant:

void logProgram (TestLog& log, const glw::Functions& gl, deUint32 program)
{
	const bool				programLinkOk	= getProgramLinkStatus(gl, program);
	const string			programInfoLog	= getProgramInfoLog(gl, program);
	tcu::ScopedLogSection	linkInfo		(log, "Program Link Info", "Program Link Info");

	{
		tcu::ScopedLogSection infoLogSection(log, "Info Log", "Info Log");

		log << TestLog::Message << programInfoLog << TestLog::EndMessage;
	}

	log << TestLog::Message << "Link result: " << (programLinkOk ? "Ok" : "Fail") << TestLog::EndMessage;
}